

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ushort uVar7;
  int unaff_EBP;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  puVar1 = info->data;
  uVar6 = info->index_map;
  uVar13 = (ulong)uVar6;
  uVar5 = *(ushort *)(puVar1 + uVar13) << 8;
  uVar7 = *(ushort *)(puVar1 + uVar13) >> 8;
  uVar4 = uVar5 | uVar7;
  switch(uVar4) {
  case 0:
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar13 + 2) << 8 | *(ushort *)(puVar1 + uVar13 + 2) >> 8
                      ) - 6)) {
      return (uint)puVar1[(long)unicode_codepoint + uVar13 + 6];
    }
    break;
  default:
    if ((uVar5 | uVar7 & 0xfffe) != 0xc) {
      iVar9 = 0x60e;
      goto LAB_001d0238;
    }
    uVar6 = *(uint *)(puVar1 + uVar13 + 0xc);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    iVar9 = 0;
    while (uVar6 - iVar9 != 0 && iVar9 <= (int)uVar6) {
      uVar8 = ((int)(uVar6 - iVar9) >> 1) + iVar9;
      lVar2 = (long)(int)uVar8 * 0xc;
      uVar12 = *(uint *)(puVar1 + lVar2 + uVar13 + 0x10);
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      bVar3 = true;
      iVar11 = unicode_codepoint - uVar12;
      if (uVar12 <= (uint)unicode_codepoint) {
        uVar12 = *(uint *)(puVar1 + lVar2 + uVar13 + 0x14);
        if ((uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) <
            (uint)unicode_codepoint) {
          iVar9 = uVar8 + 1;
          uVar8 = uVar6;
        }
        else {
          bVar3 = false;
          uVar12 = *(uint *)(puVar1 + lVar2 + uVar13 + 0x18);
          if (uVar4 != 0xc) {
            iVar11 = 0;
          }
          unaff_EBP = iVar11 + (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                               uVar12 << 0x18);
          uVar8 = uVar6;
        }
      }
      uVar6 = uVar8;
      if (!bVar3) {
        return unaff_EBP;
      }
    }
    break;
  case 2:
    iVar9 = 0x5c7;
LAB_001d0238:
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                ,iVar9,"stbtt_FindGlyphIndex","ImGui ASSERT FAILED: %s","0");
    return 0;
  case 4:
    if (unicode_codepoint < 0x10000) {
      uVar5 = *(ushort *)(puVar1 + uVar13 + 6) << 8 | *(ushort *)(puVar1 + uVar13 + 6) >> 8;
      uVar7 = *(ushort *)(puVar1 + uVar13 + 10) << 8 | *(ushort *)(puVar1 + uVar13 + 10) >> 8;
      uVar10 = (ulong)(puVar1[uVar13 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar13 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar6 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar10 + (uVar6 + 0xe)) >> 8)) {
        uVar10 = 0;
      }
      uVar12 = uVar6 + (int)uVar10 + 0xc;
      if (uVar7 != 0) {
        uVar8 = (uint)(ushort)(*(ushort *)(puVar1 + uVar13 + 8) << 8 |
                              *(ushort *)(puVar1 + uVar13 + 8) >> 8);
        do {
          uVar8 = uVar8 >> 1;
          uVar14 = uVar8 & 0xfffffffe;
          if (unicode_codepoint <=
              (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar12) << 8 |
                                 *(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar12) >> 8)) {
            uVar14 = 0;
          }
          uVar12 = uVar14 + uVar12;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar10 = (ulong)((uVar12 - uVar6) + 0x1fff4 & 0x1fffe);
      if ((int)(uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar6 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar10 + (uVar6 + 0xe)) >> 8) < unicode_codepoint)
      {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                    ,0x5eb,"stbtt_FindGlyphIndex","ImGui ASSERT FAILED: %s",
                    "unicode_codepoint <= ttUSHORT(data + endCount + 2*item)");
      }
      uVar6 = 0;
      uVar12 = (uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar5 & 0xfffffffe) + uVar13 + 0x10) <<
                              8 | *(ushort *)
                                   (puVar1 + uVar10 + (uVar5 & 0xfffffffe) + uVar13 + 0x10) >> 8);
      if ((int)uVar12 <= unicode_codepoint) {
        uVar5 = uVar5 >> 1;
        lVar2 = (ulong)((uint)uVar5 * 2) * 3;
        uVar7 = *(ushort *)(puVar1 + uVar10 + 2 + lVar2 + uVar13 + 0xe) << 8 |
                *(ushort *)(puVar1 + uVar10 + 2 + lVar2 + uVar13 + 0xe) >> 8;
        if (uVar7 == 0) {
          uVar6 = (uint)(ushort)(*(ushort *)(puVar1 + uVar10 + 2 + (ulong)uVar5 * 4 + uVar13 + 0xe)
                                 << 8 | *(ushort *)
                                         (puVar1 + uVar10 + 2 + (ulong)uVar5 * 4 + uVar13 + 0xe) >>
                                        8) + unicode_codepoint;
        }
        else {
          uVar6 = (uint)(ushort)(*(ushort *)
                                  (puVar1 + uVar10 + 0x10 +
                                            (long)(int)((unicode_codepoint - uVar12) * 2) +
                                            lVar2 + uVar13 + uVar7) << 8 |
                                *(ushort *)
                                 (puVar1 + uVar10 + 0x10 +
                                           (long)(int)((unicode_codepoint - uVar12) * 2) +
                                           lVar2 + uVar13 + uVar7) >> 8);
        }
      }
      return uVar6 & 0xffff;
    }
    break;
  case 6:
    uVar5 = *(ushort *)(puVar1 + uVar13 + 6) << 8 | *(ushort *)(puVar1 + uVar13 + 6) >> 8;
    if ((uint)unicode_codepoint < (uint)uVar5) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(puVar1 + uVar13 + 8) << 8 | *(ushort *)(puVar1 + uVar13 + 8) >> 8
                      ) + (uint)uVar5 <= (uint)unicode_codepoint) {
      return 0;
    }
    return (uint)(ushort)(*(ushort *)
                           (puVar1 + (ulong)((unicode_codepoint - (uint)uVar5) * 2) + uVar13 + 10)
                          << 8 | *(ushort *)
                                  (puVar1 + (ulong)((unicode_codepoint - (uint)uVar5) * 2) +
                                            uVar13 + 10) >> 8);
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}